

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CNFOnTheFly.cpp
# Opt level: O2

Clause * Inferences::replaceLits
                   (Clause *c,Literal *a,Literal *b,InferenceRule r,bool incAge,Literal *d,
                   Literal *e)

{
  Clause *pCVar1;
  Literal **ppLVar2;
  Clause *pCVar3;
  Literal *elem;
  uint uVar4;
  uint uVar5;
  Recycled<Lib::Stack<Kernel::Literal_*>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled> local_90;
  Clause *local_80;
  Literal *local_78;
  NonspecificInference1 local_70;
  Inference local_60;
  
  local_78 = d;
  Lib::Recycled<Lib::Stack<Kernel::Literal_*>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>::
  Recycled(&local_90);
  uVar5 = *(uint *)&c->field_0x38 & 0xfffff;
  uVar4 = (uint)(uVar5 != 0);
  ppLVar2 = (Literal **)0x0;
  local_80 = c;
  if (uVar5 != 0) {
    ppLVar2 = c->_literals;
  }
  while (ppLVar2 != (Literal **)0x0) {
    elem = *ppLVar2;
    if (*ppLVar2 == a) {
      elem = b;
    }
    Lib::Stack<Kernel::Literal_*>::push
              ((Stack<Kernel::Literal_*> *)
               local_90._self._M_t.
               super___uniq_ptr_impl<Lib::Stack<Kernel::Literal_*>,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
               ._M_t.
               super__Tuple_impl<0UL,_Lib::Stack<Kernel::Literal_*>_*,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
               .super__Head_base<0UL,_Lib::Stack<Kernel::Literal_*>_*,_false>._M_head_impl,elem);
    ppLVar2 = c->_literals + (int)uVar4;
    if (uVar5 <= uVar4) {
      ppLVar2 = (Literal **)0x0;
    }
    uVar4 = uVar4 + (uVar4 < uVar5);
  }
  if (local_78 != (Literal *)0x0) {
    Lib::Stack<Kernel::Literal_*>::push
              ((Stack<Kernel::Literal_*> *)
               local_90._self._M_t.
               super___uniq_ptr_impl<Lib::Stack<Kernel::Literal_*>,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
               ._M_t.
               super__Tuple_impl<0UL,_Lib::Stack<Kernel::Literal_*>_*,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
               .super__Head_base<0UL,_Lib::Stack<Kernel::Literal_*>_*,_false>._M_head_impl,local_78)
    ;
  }
  pCVar1 = local_80;
  local_70.premise = &local_80->super_Unit;
  local_70.rule = r;
  Kernel::Inference::Inference(&local_60,&local_70);
  pCVar3 = Kernel::Clause::fromStack
                     ((Stack<Kernel::Literal_*> *)
                      local_90._self._M_t.
                      super___uniq_ptr_impl<Lib::Stack<Kernel::Literal_*>,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_Lib::Stack<Kernel::Literal_*>_*,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
                      .super__Head_base<0UL,_Lib::Stack<Kernel::Literal_*>_*,_false>._M_head_impl,
                      &local_60);
  (pCVar3->super_Unit)._inference._age = (uint)incAge + (pCVar1->super_Unit)._inference._age;
  Lib::Recycled<Lib::Stack<Kernel::Literal_*>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>::
  ~Recycled(&local_90);
  return pCVar3;
}

Assistant:

Clause* replaceLits(Clause *c, Literal *a, Literal *b, InferenceRule r, bool incAge, Literal *d, Literal* e)
{
  RStack<Literal*> lits;

  unsigned i = 0;
  while ((*c)[i] != a) { i++; }
  for (auto l : iterTraits(c->iterLits())) {
    lits->push(l == a ? b : l);
  }
  // adding new literals at differrent places...
  if (d) { lits->push(d); }
  if (e) { lits->push(e); }
  
  auto out = Clause::fromStack(*lits, NonspecificInference1(r, c));
  // Can be either generating or simplifying. Therefore use NonspecificInference
  // Age is updated in some instances, but not in others based on empirical evaluation
  out->setAge(incAge? c->age() + 1 : c->age());
  return out;
}